

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O0

void __thiscall
Js::WasmByteCodeWriter::AddJumpOffset
          (WasmByteCodeWriter *this,OpCodeAsmJs op,ByteCodeLabel labelId,uint fieldByteOffset)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JumpInfo local_28;
  JumpInfo jumpInfo;
  uint jumpByteOffset;
  uint fieldByteOffset_local;
  ByteCodeLabel labelId_local;
  OpCodeAsmJs op_local;
  WasmByteCodeWriter *this_local;
  
  jumpInfo.patchOffset = fieldByteOffset;
  if (99 < fieldByteOffset) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/AsmJsByteCodeWriter.cpp"
                                ,0x292,"(fieldByteOffset < 100)","Ensure valid field offset");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  ByteCodeWriter::CheckOpen(&this->super_ByteCodeWriter);
  ByteCodeWriter::CheckLabel(&this->super_ByteCodeWriter,labelId);
  local_28.patchOffset =
       ByteCodeWriter::Data::GetCurrentOffset(&(this->super_ByteCodeWriter).m_byteCodeData);
  local_28.patchOffset = local_28.patchOffset - jumpInfo.patchOffset;
  local_28.labelId = labelId;
  jumpInfo.labelId = local_28.patchOffset;
  JsUtil::
  List<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ::Add((this->super_ByteCodeWriter).m_jumpOffsets,&local_28);
  return;
}

Assistant:

void AsmJsByteCodeWriter::AddJumpOffset(Js::OpCodeAsmJs op, ByteCodeLabel labelId, uint fieldByteOffset)
    {
        AssertMsg(fieldByteOffset < 100, "Ensure valid field offset");
        CheckOpen();
        CheckLabel(labelId);

        uint jumpByteOffset = m_byteCodeData.GetCurrentOffset() - fieldByteOffset;

        //
        // Branch targets are created in two passes:
        // - In the instruction stream, write "labelID" into "OpLayoutBrC.Offset". Record this
        //   location in "m_jumpOffsets" to be patched later.
        // - When the bytecode is closed, update all "OpLayoutBrC.Offset"'s with their actual
        //   destinations.
        //

        JumpInfo jumpInfo = { labelId, jumpByteOffset };
        m_jumpOffsets->Add(jumpInfo);
    }